

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O1

void __thiscall Catch::clara::detail::Args::Args(Args *this,int argc,char **argv)

{
  allocator_type local_1a;
  allocator local_19;
  
  ::std::__cxx11::string::string((string *)this,*argv,&local_19);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<char_const*const*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_args,
             argv + 1,argv + argc,&local_1a);
  return;
}

Assistant:

Args( int argc, char const* const* argv )
            : m_exeName(argv[0]),
              m_args(argv + 1, argv + argc) {}